

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkList.c
# Opt level: O0

void TraverseDlist(DuNode_conflict List)

{
  DuNode *local_18;
  DuNode_conflict P;
  DuNode_conflict List_local;
  
  local_18 = List->Next;
  printf(anon_var_dwarf_af);
  if (local_18 == (DuNode *)0x0) {
    printf(anon_var_dwarf_b9);
  }
  for (; local_18 != (DuNode *)0x0; local_18 = local_18->Next) {
    printf("%d ",(ulong)(uint)local_18->Element);
  }
  printf(anon_var_dwarf_23 + 0x13);
  return;
}

Assistant:

void TraverseDlist(DuNode List) {
    DuNode P = List->Next;    //    首节点赋值给临时节点P
    printf("遍历链表的值为：");
    if (P == NULL)
        printf("链表为空");
    while (P != NULL)        //当临时节点P不为尾节点时，输出当前节点值
    {
        printf("%d ", P->Element);
        P = P->Next;
    }
    printf("\n");
}